

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::aEnqueue(SAT *this,Lit p,Reason r,int l)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int *piVar4;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar5;
  uchar *in_RCX;
  anon_union_8_2_743a5d44_for_Reason_0 in_RDX;
  size_t *siglen;
  uchar *in_RSI;
  long in_RDI;
  size_t in_R8;
  int v;
  int in_stack_0000016c;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_00000208;
  ostream *in_stack_ffffffffffffff38;
  vec<Lit> *in_stack_ffffffffffffff40;
  lbool local_89;
  int local_88;
  uint local_84;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  string local_78 [52];
  int local_44;
  string local_40 [36];
  uint local_1c;
  anon_union_8_2_743a5d44_for_Reason_0 local_10;
  Lit local_4;
  
  local_4.x = (int)in_RSI;
  local_1c = (uint)in_RCX;
  local_10 = in_RDX;
  if (so.debug) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"a-enqueue literal ");
    local_44 = local_4.x;
    toInt(local_4);
    getLitString_abi_cxx11_(in_stack_0000016c);
    poVar2 = std::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2," because ");
    local_80 = local_10;
    showReason_abi_cxx11_((Reason)in_stack_00000208);
    in_stack_ffffffffffffff40 = (vec<Lit> *)std::operator<<(poVar2,local_78);
    in_stack_ffffffffffffff38 = std::operator<<((ostream *)in_stack_ffffffffffffff40," and l=");
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff38,local_1c);
    in_RSI = "\n";
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
  }
  local_88 = local_4.x;
  local_84 = ::var(local_4);
  iVar1 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_4.x,in_RSI,siglen,in_RCX,in_R8);
  lbool::lbool(&local_89,(bool)(((byte)iVar1 ^ 0xff) & 1));
  iVar1 = toInt((lbool)0x0);
  pcVar3 = vec<signed_char>::operator[]((vec<signed_char> *)(in_RDI + 0x50),local_84);
  *pcVar3 = (char)iVar1;
  piVar4 = vec<int>::operator[](&engine.trail_lim,local_1c);
  iVar1 = *piVar4;
  piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x70),local_84);
  *piVar4 = iVar1 + -1;
  paVar5 = &vec<Reason>::operator[]((vec<Reason> *)(in_RDI + 0x60),local_84)->field_0;
  *paVar5 = local_10;
  vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),local_1c);
  vec<Lit>::push(in_stack_ffffffffffffff40,(Lit *)in_stack_ffffffffffffff38);
  return;
}

Assistant:

void SAT::aEnqueue(Lit p, Reason r, int l) {
	if (so.debug) {
		std::cerr << "a-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
							<< " and l=" << l << "\n";
	}
	assert(value(p) == l_Undef);
	const int v = var(p);
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trail_lim[l] - 1;
	reason[v] = r;
	trail[l].push(p);
}